

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

int __thiscall cmCursesMainForm::Generate(cmCursesMainForm *this)

{
  cmake *pcVar1;
  bool bVar2;
  cmCursesLongMessageForm *this_00;
  uint local_108;
  uint local_104;
  int local_d4;
  uint local_c8;
  uint local_c4;
  cmCursesLongMessageForm *msgs;
  char *title;
  int yy;
  int xx;
  int local_7c;
  undefined1 auStack_78 [4];
  int retVal;
  pointer pbStack_70;
  pointer local_68;
  anon_class_8_1_8991fb9c local_48;
  ProgressCallbackType local_40;
  uint local_20;
  uint local_1c;
  int yi;
  int xi;
  cmCursesMainForm *this_local;
  
  if (_stdscr == 0) {
    local_c4 = 0xffffffff;
  }
  else {
    local_c4 = (int)*(short *)(_stdscr + 4) + 1;
  }
  local_20 = local_c4;
  if (_stdscr == 0) {
    local_c8 = 0xffffffff;
  }
  else {
    local_c8 = (int)*(short *)(_stdscr + 6) + 1;
  }
  local_1c = local_c8;
  _yi = this;
  curses_move(1,1);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Generating, please wait...");
  PrintKeys(this,1);
  if (_stdscr == 0) {
    local_d4 = -1;
  }
  else {
    local_d4 = *(short *)(_stdscr + 4) + 1;
  }
  wtouchln(_stdscr,0,local_d4,1);
  refresh();
  pcVar1 = this->CMakeInstance;
  local_48.this = this;
  std::function<void(std::__cxx11::string_const&,float)>::
  function<cmCursesMainForm::Generate()::__0,void>
            ((function<void(std::__cxx11::string_const&,float)> *)&local_40,&local_48);
  cmake::SetProgressCallback(pcVar1,&local_40);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function(&local_40);
  _auStack_78 = (pointer)0x0;
  pbStack_70 = (pointer)0x0;
  local_68 = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)auStack_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&this->Errors,
              (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)auStack_78);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)auStack_78);
  local_7c = cmake::Generate(this->CMakeInstance);
  pcVar1 = this->CMakeInstance;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
              *)&yy,(nullptr_t)0x0);
  cmake::SetProgressCallback
            (pcVar1,(function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
                     *)&yy);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_float)>
               *)&yy);
  keypad(_stdscr,1);
  if ((local_7c != 0) ||
     (bVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty(&this->Errors), !bVar2)) {
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar2) {
      this->OkToGenerate = false;
    }
    cmSystemTools::ResetErrorOccuredFlag();
    if (_stdscr == 0) {
      local_104 = 0xffffffff;
      local_108 = 0xffffffff;
    }
    else {
      local_104 = (int)*(short *)(_stdscr + 4) + 1;
      local_108 = (int)*(short *)(_stdscr + 6) + 1;
    }
    msgs = (cmCursesLongMessageForm *)anon_var_dwarf_1c448;
    bVar2 = cmSystemTools::GetErrorOccuredFlag();
    if (bVar2) {
      msgs = (cmCursesLongMessageForm *)anon_var_dwarf_1c3fa;
    }
    this_00 = (cmCursesLongMessageForm *)operator_new(0x60);
    cmCursesLongMessageForm::cmCursesLongMessageForm(this_00,&this->Errors,(char *)msgs);
    cmCursesForm::CurrentForm = (cmCursesForm *)this_00;
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[3])
              (this_00,1,1,(ulong)local_108,(ulong)local_104);
    (*(this_00->super_cmCursesForm)._vptr_cmCursesForm[2])();
    if (local_7c == -2) {
      return -2;
    }
    cmCursesForm::CurrentForm = &this->super_cmCursesForm;
    (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_108,(ulong)local_104);
  }
  InitializeUI(this);
  (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])(this,1,1,(ulong)local_1c,(ulong)local_20);
  return 0;
}

Assistant:

int cmCursesMainForm::Generate()
{
  int xi, yi;
  getmaxyx(stdscr, yi, xi);

  curses_move(1, 1);
  this->UpdateStatusBar("Generating, please wait...");
  this->PrintKeys(1);
  touchwin(stdscr);
  refresh();
  this->CMakeInstance->SetProgressCallback(
    [this](const std::string& msg, float prog) {
      this->UpdateProgress(msg, prog);
    });

  // Get rid of previous errors
  this->Errors = std::vector<std::string>();

  // run the generate process
  int retVal = this->CMakeInstance->Generate();

  this->CMakeInstance->SetProgressCallback(nullptr);
  keypad(stdscr, true); /* Use key symbols as KEY_DOWN */

  if (retVal != 0 || !this->Errors.empty()) {
    // see if there was an error
    if (cmSystemTools::GetErrorOccuredFlag()) {
      this->OkToGenerate = false;
    }
    // reset error condition
    cmSystemTools::ResetErrorOccuredFlag();
    int xx, yy;
    getmaxyx(stdscr, yy, xx);
    const char* title = "Messages during last pass.";
    if (cmSystemTools::GetErrorOccuredFlag()) {
      title = "Errors occurred during the last pass.";
    }
    cmCursesLongMessageForm* msgs =
      new cmCursesLongMessageForm(this->Errors, title);
    CurrentForm = msgs;
    msgs->Render(1, 1, xx, yy);
    msgs->HandleInput();
    // If they typed the wrong source directory, we report
    // an error and exit
    if (retVal == -2) {
      return retVal;
    }
    CurrentForm = this;
    this->Render(1, 1, xx, yy);
  }

  this->InitializeUI();
  this->Render(1, 1, xi, yi);

  return 0;
}